

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O2

Vec_Wec_t * Abc_ExorcismNtk2Esop(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Abc_Obj_t *pAVar4;
  void *pvVar5;
  Vec_Wec_t *pVVar6;
  Abc_Obj_t *pAVar7;
  int iVar8;
  long lVar9;
  Vec_Int_t *p;
  uint uVar10;
  int Entry;
  uint i;
  char *pcVar11;
  uint uVar12;
  Vec_Int_t *local_60;
  
  iVar1 = pNtk->vCis->nSize;
  uVar12 = 0;
  for (iVar8 = 0; iVar8 < pNtk->vCos->nSize; iVar8 = iVar8 + 1) {
    pAVar4 = Abc_NtkCo(pNtk,iVar8);
    pAVar4 = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
    uVar3 = 1;
    if ((*(uint *)&pAVar4->field_0x14 & 0xf) == 7) {
      iVar2 = Abc_NodeIsConst(pAVar4);
      if (iVar2 == 0) {
        uVar3 = Abc_SopGetCubeNum((char *)(pAVar4->field_5).pData);
      }
      else {
        iVar2 = Abc_NodeIsConst1(pAVar4);
        uVar3 = (uint)(iVar2 != 0);
      }
    }
    uVar12 = uVar12 + uVar3;
  }
  for (lVar9 = 0; lVar9 < pNtk->vCis->nSize; lVar9 = lVar9 + 1) {
    pvVar5 = Vec_PtrEntry(pNtk->vCis,(int)lVar9);
    *(long *)((long)pvVar5 + 0x40) = lVar9;
  }
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar12) {
    uVar3 = uVar12 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = uVar3;
  if (uVar3 == 0) {
    local_60 = (Vec_Int_t *)0x0;
  }
  else {
    local_60 = (Vec_Int_t *)calloc((long)(int)uVar3,0x10);
  }
  uVar12 = 0;
  pVVar6->pArray = local_60;
  i = 0;
  do {
    if (pNtk->vCos->nSize <= (int)i) {
      return pVVar6;
    }
    pAVar4 = Abc_NtkCo(pNtk,i);
    pAVar4 = Abc_ObjFanin0Ntk((Abc_Obj_t *)pAVar4->pNtk->vObjs->pArray[*(pAVar4->vFanins).pArray]);
    iVar8 = Abc_NodeIsConst(pAVar4);
    if (iVar8 == 0) {
      iVar8 = (pAVar4->vFanins).nSize;
      for (pcVar11 = (char *)(pAVar4->field_5).pData; *pcVar11 != '\0';
          pcVar11 = pcVar11 + (long)iVar8 + 3) {
        if (uVar12 == uVar3) {
          uVar10 = uVar3 * 2;
          if ((int)uVar3 < 0x10) {
            uVar10 = 0x10;
          }
          if (uVar10 - uVar3 != 0 && (int)uVar3 <= (int)uVar10) {
            if (local_60 == (Vec_Int_t *)0x0) {
              local_60 = (Vec_Int_t *)malloc((ulong)uVar10 << 4);
            }
            else {
              local_60 = (Vec_Int_t *)realloc(local_60,(ulong)uVar10 << 4);
            }
            pVVar6->pArray = local_60;
            memset(local_60 + (int)uVar3,0,(long)(int)(uVar10 - uVar3) << 4);
            pVVar6->nCap = uVar10;
            uVar3 = uVar10;
          }
        }
        uVar10 = uVar12 + 1;
        pVVar6->nSize = uVar10;
        if ((int)uVar12 < 0) {
          __assert_fail("p->nSize > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                        ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
        }
        p = local_60 + ((ulong)uVar10 - 1);
        Vec_IntGrow(p,iVar1 + 2);
        iVar2 = 1;
        for (lVar9 = 0; lVar9 < (pAVar4->vFanins).nSize; lVar9 = lVar9 + 1) {
          pAVar7 = Abc_ObjFanin0Ntk((Abc_Obj_t *)
                                    pAVar4->pNtk->vObjs->pArray[(pAVar4->vFanins).pArray[lVar9]]);
          if (iVar1 <= (pAVar7->field_6).iTemp) {
            __assert_fail("(int)(ABC_PTRUINT_T)pFanin->pCopy < nIns",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exor.c"
                          ,0x3e6,"Vec_Wec_t *Abc_ExorcismNtk2Esop(Abc_Ntk_t *)");
          }
          if (pcVar11[lVar9] == '1') {
            Entry = (int)lVar9 * 2;
LAB_002f2562:
            Vec_IntPush(p,Entry);
          }
          else {
            Entry = iVar2;
            if (pcVar11[lVar9] == '0') goto LAB_002f2562;
          }
          iVar2 = iVar2 + 2;
        }
        Vec_IntPush(p,~i);
        uVar12 = uVar10;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Abc_ExorcismNtk2Esop( Abc_Ntk_t * pNtk )
{
    Vec_Wec_t * vEsop = NULL;
    Abc_Obj_t * pNode, * pFanin, * pDriver;
    char * pCube;
    int nIns, nOuts, nProducts, nFanins, i, k;

    nIns = Abc_NtkCiNum( pNtk );
    nOuts = Abc_NtkCoNum( pNtk );

    nProducts = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( !Abc_ObjIsNode(pDriver) )
        {
            nProducts++;
            continue;
        }
        if ( Abc_NodeIsConst(pDriver) )
        {
            if ( Abc_NodeIsConst1(pDriver) )
                nProducts++;
            continue;
        }
        nProducts += Abc_SopGetCubeNum((char *)pDriver->pData);
    }

    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRUINT_T)i;

    vEsop = Vec_WecAlloc( nProducts+1 );

    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pDriver = Abc_ObjFanin0Ntk( Abc_ObjFanin0(pNode) );
        if ( Abc_NodeIsConst(pDriver) ) continue;

        nFanins = Abc_ObjFaninNum(pDriver);
        Abc_SopForEachCube( (char *)pDriver->pData, nFanins, pCube )
        {
            Vec_Int_t *vCubeIn = Vec_WecPushLevel( vEsop );
            Vec_IntGrow( vCubeIn, nIns+2 );

            Abc_ObjForEachFanin( pDriver, pFanin, k )
            {
                pFanin = Abc_ObjFanin0Ntk(pFanin);
                assert( (int)(ABC_PTRUINT_T)pFanin->pCopy < nIns );
                if ( pCube[k] == '0' )
                {
                    Vec_IntPush( vCubeIn, 2*k + 1 );
                }
                else if ( pCube[k] == '1' )
                {
                    Vec_IntPush( vCubeIn, 2*k );
                }
            }
            Vec_IntPush( vCubeIn, -( i + 1 ) );
        }
    }

    return vEsop;
}